

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O0

void __thiscall
lumeview::Renderer::add_stage
          (Renderer *this,string *name,SPMesh *mesh,GrobSet grobSet,ShadingPreset shading)

{
  bool bVar1;
  grob_set_t gVar2;
  index_t iVar3;
  index_t iVar4;
  element_type *peVar5;
  ostream *poVar6;
  string *psVar7;
  LumeviewError *pLVar8;
  string local_458 [32];
  stringstream local_438 [8];
  stringstream ss_1;
  ostream local_428 [376];
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_2b0;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_2a0;
  undefined1 local_290 [8];
  Stage newStage;
  string local_1e8 [48];
  stringstream local_1b8 [8];
  stringstream ss;
  ostream local_1a8 [376];
  index_t local_30;
  ShadingPreset local_2c;
  SPMesh *pSStack_28;
  ShadingPreset shading_local;
  SPMesh *mesh_local;
  string *name_local;
  Renderer *this_local;
  GrobSet grobSet_local;
  
  local_2c = shading;
  pSStack_28 = mesh;
  mesh_local = (SPMesh *)name;
  name_local = (string *)this;
  this_local._4_4_ = grobSet.m_offset;
  peVar5 = std::__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      mesh);
  local_30 = this_local._4_4_;
  bVar1 = lume::Mesh::has(peVar5,this_local._4_4_);
  if (!bVar1) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar6 = std::operator<<(local_1a8,"Requested grob type \'");
    psVar7 = lume::GrobSet::name_abi_cxx11_((GrobSet *)((long)&this_local + 4));
    poVar6 = std::operator<<(poVar6,(string *)psVar7);
    std::operator<<(poVar6,"\' is not provided by the specified mesh.");
    newStage._159_1_ = 1;
    pLVar8 = (LumeviewError *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringstream::str();
    LumeviewError::LumeviewError(pLVar8,local_1e8);
    newStage._159_1_ = 0;
    __cxa_throw(pLVar8,&LumeviewError::typeinfo,LumeviewError::~LumeviewError);
  }
  Stage::Stage((Stage *)local_290);
  std::shared_ptr<lume::Mesh>::operator=((shared_ptr<lume::Mesh> *)&newStage.field_0x18,mesh);
  gVar2 = lume::GrobSet::type((GrobSet *)((long)&this_local + 4));
  if (gVar2 == EDGES) {
    newStage.indBuf.super___shared_ptr<lumeview::GLBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._0_4_ = 1;
    glm::tvec4<float,_(glm::precision)0>::tvec4
              ((tvec4<float,_(glm::precision)0> *)&local_2a0.field_0,0.2,0.2,1.0,0.5);
    newStage._44_8_ = local_2a0._0_8_;
    newStage.color.field_0._0_8_ = local_2a0._8_8_;
    newStage.color.field_0.field_0.z = 0.99;
    newStage.color.field_0.field_0.w = 1.0;
    peVar5 = std::__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )mesh);
    newStage.indBuf.super___shared_ptr<lumeview::GLBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._4_4_ = lume::Mesh::num_indices(peVar5,EDGE);
  }
  else {
    if ((1 < gVar2 - TRIS) && (gVar2 != FACES)) {
      std::__cxx11::stringstream::stringstream(local_438);
      std::operator<<(local_428,
                      "Renderer::add_stage: Unsupported grid object type in specified mesh.");
      pLVar8 = (LumeviewError *)__cxa_allocate_exception(0x30);
      std::__cxx11::stringstream::str();
      LumeviewError::LumeviewError(pLVar8,local_458);
      __cxa_throw(pLVar8,&LumeviewError::typeinfo,LumeviewError::~LumeviewError);
    }
    newStage.indBuf.super___shared_ptr<lumeview::GLBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._0_4_ = 4;
    glm::tvec4<float,_(glm::precision)0>::tvec4
              ((tvec4<float,_(glm::precision)0> *)&local_2b0.field_0,1.0,1.0,1.0,1.0);
    newStage._44_8_ = local_2b0._0_8_;
    newStage.color.field_0._0_8_ = local_2b0._8_8_;
    newStage.color.field_0.field_0.z = 1.0;
    newStage.color.field_0.field_0.w = 1.0;
    peVar5 = std::__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )mesh);
    iVar3 = lume::Mesh::num_indices(peVar5,TRI);
    peVar5 = std::__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )mesh);
    iVar4 = lume::Mesh::num_indices(peVar5,QUAD);
    newStage.indBuf.super___shared_ptr<lumeview::GLBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._4_4_ = iVar3 + (iVar4 * 3 >> 1);
  }
  newStage.mesh.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
       local_2c;
  std::__cxx11::string::operator=((string *)local_290,(string *)name);
  newStage.primType = this_local._4_4_;
  std::vector<lumeview::Renderer::Stage,_std::allocator<lumeview::Renderer::Stage>_>::push_back
            (&this->m_stages,(value_type *)local_290);
  Stage::~Stage((Stage *)local_290);
  return;
}

Assistant:

void Renderer::
add_stage (	std::string name,
            SPMesh mesh,
            const GrobSet grobSet,
            ShadingPreset shading)
{
	COND_THROW (!mesh->has (grobSet),
	            "Requested grob type '" << grobSet.name()
	            << "' is not provided by the specified mesh.");

	Stage newStage;
	newStage.mesh = mesh;

	switch (grobSet.type()) {
		case EDGES:
			newStage.primType = GL_LINES;
			newStage.color = glm::vec4 (0.2f, 0.2f, 1.0f, 0.5f);
			newStage.zfacNear = 0.99f;
			newStage.zfacFar = 1.f;
			newStage.numInds = mesh->num_indices (EDGE);
			break;
		
		case TRIS:
		case QUADS:
		case FACES:
			newStage.primType = GL_TRIANGLES;
			newStage.color = glm::vec4 (1.0f, 1.0f, 1.0f, 1.0f);
			newStage.zfacNear = 1.0f;
			newStage.zfacFar = 1.0f;
			newStage.numInds = mesh->num_indices(TRI)
					 		 + 3 * mesh->num_indices(QUAD) / 2;
			break;
		default:
			THROW("Renderer::add_stage: Unsupported grid object type in specified mesh.");
	}

	newStage.shadingPreset = shading;
	newStage.name = std::move (name);
	newStage.grobSet = grobSet;
	m_stages.push_back (std::move(newStage));
}